

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineOutputFile.cpp
# Opt level: O2

void __thiscall
Imf_2_5::DeepScanLineOutputFile::DeepScanLineOutputFile
          (DeepScanLineOutputFile *this,OStream *os,Header *header,int numThreads)

{
  int iVar1;
  Data *pDVar2;
  OutputStreamMutex *pOVar3;
  undefined4 extraout_var;
  Int64 IVar4;
  stringstream _iex_replace_s;
  
  GenericOutputFile::GenericOutputFile(&this->super_GenericOutputFile);
  (this->super_GenericOutputFile)._vptr_GenericOutputFile =
       (_func_int **)&PTR__DeepScanLineOutputFile_00421a10;
  pDVar2 = (Data *)operator_new(0x180);
  Data::Data(pDVar2,numThreads);
  this->_data = pDVar2;
  pOVar3 = (OutputStreamMutex *)operator_new(0x38);
  (pOVar3->super_Mutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  pOVar3->os = (OStream *)0x0;
  pOVar3->currentPosition = 0;
  *(undefined8 *)((long)&(pOVar3->super_Mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (pOVar3->super_Mutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (pOVar3->super_Mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(pOVar3->super_Mutex).super___mutex_base._M_mutex + 8) = 0;
  pDVar2->_streamData = pOVar3;
  pDVar2->_deleteStream = false;
  Header::sanityCheck(header,false,false);
  this->_data->_streamData->os = os;
  initialize(this,header);
  iVar1 = (*this->_data->_streamData->os->_vptr_OStream[3])();
  pDVar2 = this->_data;
  pOVar3 = pDVar2->_streamData;
  pOVar3->currentPosition = CONCAT44(extraout_var,iVar1);
  GenericOutputFile::writeMagicNumberAndVersionField
            (&this->super_GenericOutputFile,pOVar3->os,&pDVar2->header);
  IVar4 = Header::writeTo(&this->_data->header,this->_data->_streamData->os,false);
  pDVar2 = this->_data;
  pDVar2->previewPosition = IVar4;
  IVar4 = anon_unknown_7::writeLineOffsets(pDVar2->_streamData->os,&pDVar2->lineOffsets);
  pDVar2 = this->_data;
  pDVar2->lineOffsetsPosition = IVar4;
  pDVar2->multipart = false;
  return;
}

Assistant:

DeepScanLineOutputFile::DeepScanLineOutputFile
    (OPENEXR_IMF_INTERNAL_NAMESPACE::OStream &os,
     const Header &header,
     int numThreads)
:
    _data (new Data (numThreads))
    
{
    _data->_streamData   = new OutputStreamMutex ();
    _data->_deleteStream = false;
    try
    {
        header.sanityCheck();
        _data->_streamData->os = &os;
        initialize (header);
        _data->_streamData->currentPosition = _data->_streamData->os->tellp();

        // Write header and empty offset table to the file.
        writeMagicNumberAndVersionField(*_data->_streamData->os, _data->header);
        _data->previewPosition =
                _data->header.writeTo (*_data->_streamData->os);
        _data->lineOffsetsPosition =
                writeLineOffsets (*_data->_streamData->os, _data->lineOffsets);
	_data->multipart=false;
    }
    catch (IEX_NAMESPACE::BaseExc &e)
    {
        delete _data->_streamData;
        delete _data;

        REPLACE_EXC (e, "Cannot open image file "
                     "\"" << os.fileName() << "\". " << e.what());
        throw;
    }
    catch (...)
    {
        delete _data->_streamData;
        delete _data;
        throw;
    }
}